

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solution.cpp
# Opt level: O2

void __thiscall Solution::validate(Solution *this)

{
  Solution *pSVar1;
  mapped_type *pmVar2;
  long *plVar3;
  long *plVar4;
  int iVar5;
  shared_ptr<VehicleState> vs;
  Solution *local_48;
  __shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  pSVar1 = this;
  while (pSVar1 = (Solution *)
                  (pSVar1->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>._M_impl
                  ._M_node.super__List_node_base._M_next, pSVar1 != this) {
    plVar3 = (long *)((pSVar1->vehicles).super__List_base<Vehicle_*,_std::allocator<Vehicle_*>_>.
                      _M_impl._M_node._M_size + 8);
    iVar5 = 0;
    plVar4 = plVar3;
    while (plVar4 = (long *)*plVar4, plVar4 != plVar3) {
      std::__shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,(__shared_ptr<VehicleState,_(__gnu_cxx::_Lock_policy)2> *)(plVar4 + 2));
      local_48 = this;
      pmVar2 = std::__detail::
               _Map_base<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<Solution_*,_std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>,_std::allocator<std::pair<Solution_*const,_std::pair<Vehicle_*,_int>_>_>,_std::__detail::_Select1st,_std::equal_to<Solution_*>,_std::hash<Solution_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&(local_40._M_ptr)->p->state,&local_48);
      if (iVar5 != pmVar2->second) {
        std::operator<<((ostream *)&std::cout,"invalid state");
      }
      iVar5 = iVar5 + 1;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
  }
  return;
}

Assistant:

void Solution::validate() {
    for (auto vehicle: vehicles) {
        auto i = 0;
        for (auto it = vehicle->nodes.begin(); it != vehicle->nodes.end(); ++it) {
            auto vs = *it;
            auto pos = vs->p->state[this].second;
            if (i != pos) {
                std::cout << "invalid state";
            }
            i++;
        }
    }
}